

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_enableSimplifierAndScaler
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Settings *pSVar1;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  cpp_dec_float<50u,int,void> *this_00;
  Real a;
  cpp_dec_float<50u,int,void> local_98 [64];
  cpp_dec_float<50u,int,void> local_58 [64];
  
  this_00 = local_98;
  pSVar1 = this->_currentSettings;
  switch(pSVar1->_intParamValues[10]) {
  case 0:
    this->_simplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    break;
  case 1:
  case 3:
    this->_simplifier =
         &(this->_simplifierMainSM).
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    a = pSVar1->_realParamValues[0x12];
    this_00 = local_58;
    goto LAB_0034ae8f;
  case 2:
    this->_simplifier =
         &(this->_simplifierMainSM).
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    a = pSVar1->_realParamValues[0x12];
LAB_0034ae8f:
    *(undefined8 *)(this_00 + 0x30) = 0xa00000000;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    *(undefined8 *)(this_00 + 0x18) = 0;
    *(undefined8 *)(this_00 + 0x1d) = 0;
    *(undefined8 *)(this_00 + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_00,a);
    (*(this->_simplifierMainSM).
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ._vptr_SPxSimplifier[0x12])(&this->_simplifierMainSM,this_00);
  }
  switch(this->_currentSettings->_intParamValues[0xb]) {
  case 0:
    pSVar2 = (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
    break;
  case 1:
    pSVar2 = &(this->_scalerUniequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 2:
    pSVar2 = &(this->_scalerBiequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 3:
    pSVar2 = &(this->_scalerGeo1).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 4:
    pSVar2 = &(this->_scalerGeo8).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 5:
    pSVar2 = &(this->_scalerLeastsq).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  case 6:
    pSVar2 = &(this->_scalerGeoequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    break;
  default:
    goto switchD_0034aeda_default;
  }
  this->_scaler = pSVar2;
switchD_0034aeda_default:
  return;
}

Assistant:

void SoPlexBase<R>::_enableSimplifierAndScaler()
{
   // type of simplifier
   switch(intParam(SoPlexBase<R>::SIMPLIFIER))
   {
   case SIMPLIFIER_OFF:
      _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = nullptr;
#endif
      break;

   case SIMPLIFIER_AUTO:
   case SIMPLIFIER_INTERNAL:
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif
      break;

   case SIMPLIFIER_PAPILO:
#ifdef SOPLEX_WITH_PAPILO
      _simplifier = &_simplifierPaPILO;
      assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierPaPILO;
      assert(_boostedSimplifier != nullptr);
#endif
#else
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif // !SOPLEX_WITH_MPFR
#endif // SOPLEX_WITH_PAPILO
      break;

   default:
      break;
   }

   // type of scaler
   switch(intParam(SoPlexBase<R>::SCALER))
   {
   case SCALER_OFF:
      _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif
      break;

   case SCALER_UNIEQUI:
      _scaler = &_scalerUniequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerUniequi;
#endif
      break;

   case SCALER_BIEQUI:
      _scaler = &_scalerBiequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerBiequi;
#endif
      break;

   case SCALER_GEO1:
      _scaler = &_scalerGeo1;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo1;
#endif
      break;

   case SCALER_GEO8:
      _scaler = &_scalerGeo8;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo8;
#endif
      break;

   case SCALER_LEASTSQ:
      _scaler = &_scalerLeastsq;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerLeastsq;
#endif
      break;

   case SCALER_GEOEQUI:
      _scaler = &_scalerGeoequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeoequi;
#endif
      break;

   default:
      break;
   }
}